

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

string * __thiscall Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Token *this_local;
  
  if ((((this->type == String) || (this->type == Integer)) || (this->type == Float)) ||
     ((this->type == Identifier || (this->type == Error)))) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->literal);
  }
  else {
    tokTypeToString_abi_cxx11_(__return_storage_ptr__,this->type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() {
        if (type == TokenType::String ||
            type == TokenType::Integer ||
            type == TokenType::Float ||
            type == TokenType::Identifier ||
            type == TokenType::Error) {
            return literal;
        } else return tokTypeToString(type);
    }